

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

Pass * wasm::createHeap2LocalPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x108);
  memset(this,0,0x108);
  anon_unknown_100::Heap2Local::Heap2Local((Heap2Local *)this);
  return this;
}

Assistant:

Pass* createHeap2LocalPass() { return new Heap2Local(); }